

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O1

void divsufsortxx::doubling::
     updategroup<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
               (iterator ISA,iterator SA,iterator first,iterator last)

{
  long lVar1;
  int iVar2;
  int extraout_var;
  undefined4 extraout_var_00;
  int extraout_var_01;
  undefined4 extraout_var_02;
  int extraout_var_03;
  undefined4 extraout_var_04;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  BitmapArray<long> *pBVar6;
  BitmapArray<long> *pBVar7;
  ulong uVar8;
  
  uVar8 = first.pos_;
  pBVar7 = first.array_;
  pBVar6 = ISA.array_;
  if (uVar8 < last.pos_) {
    do {
      (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,uVar8);
      uVar5 = uVar8;
      if (-1 < extraout_var) {
        lVar1 = -1;
        do {
          uVar4 = uVar5;
          lVar3 = lVar1;
          iVar2 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,uVar4);
          (*(pBVar6->super_Bitmap)._vptr_Bitmap[4])
                    (pBVar6,CONCAT44(extraout_var_00,iVar2) + ISA.pos_,uVar4 + -SA.pos_);
          uVar5 = uVar4 + 1;
          if (last.pos_ <= uVar5) break;
          (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,uVar5);
          lVar1 = lVar3 + -1;
        } while (-1 < extraout_var_01);
        (*(pBVar7->super_Bitmap)._vptr_Bitmap[4])(pBVar7,uVar8,lVar3);
        uVar8 = uVar4 + 1;
        uVar5 = uVar8;
        if (last.pos_ <= uVar8) {
          return;
        }
      }
      do {
        uVar4 = uVar5;
        iVar2 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,uVar4);
        (*(pBVar7->super_Bitmap)._vptr_Bitmap[4])(pBVar7,uVar4,~CONCAT44(extraout_var_02,iVar2));
        uVar5 = uVar4 + 1;
        (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,uVar5);
      } while (extraout_var_03 < 0);
      do {
        iVar2 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,uVar8);
        (*(pBVar6->super_Bitmap)._vptr_Bitmap[4])
                  (pBVar6,CONCAT44(extraout_var_04,iVar2) + ISA.pos_,-SA.pos_ + uVar5);
        uVar8 = uVar8 + 1;
      } while (uVar8 <= uVar5);
      uVar8 = uVar4 + 2;
    } while (uVar8 < last.pos_);
  }
  return;
}

Assistant:

void updategroup(ISAIterator_type ISA, const SAIterator_type SA,
                 SAIterator_type first, SAIterator_type last) {
  typedef typename std::iterator_traits<ISAIterator_type>::value_type value_type;
  SAIterator_type a, b;
  value_type t;

  for (a = first; a < last; ++a) {
    if (0 <= *a) {
      b = a;
      do {
        ISA[*a] = a - SA;
      } while ((++a < last) && (0 <= *a));
      *b = b - a;
      if (last <= a) {
        break;
      }
    }
    b = a;
    do {
      *a = ~*a;
    } while (*++a < 0);
    t = a - SA;
    do {
      ISA[*b] = t;
    } while (++b <= a);
  }
}